

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::SizeCheck(MDLImporter *this,void *szPos,char *szFile,uint iLine)

{
  DeadlyImportError *this_00;
  allocator local_459;
  string local_458;
  char local_438 [8];
  char szBuffer [1024];
  char *local_30;
  char *szFilePtr;
  uint iLine_local;
  char *szFile_local;
  void *szPos_local;
  MDLImporter *this_local;
  
  if (szFile == (char *)0x0) {
    __assert_fail("__null != szFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x108,
                  "void Assimp::MDLImporter::SizeCheck(const void *, const char *, unsigned int)");
  }
  if ((szPos != (void *)0x0) && (szPos <= this->mBuffer + this->iFileSize)) {
    return;
  }
  local_30 = strrchr(szFile,0x5c);
  if ((local_30 == (char *)0x0) && (local_30 = strrchr(szFile,0x2f), local_30 == (char *)0x0)) {
    local_30 = szFile;
  }
  if (local_30 != (char *)0x0) {
    local_30 = local_30 + 1;
  }
  sprintf(local_438,
          "Invalid MDL file. The file is too small or contains invalid data (File: %s Line: %u)",
          local_30,(ulong)iLine);
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,local_438,&local_459);
  DeadlyImportError::DeadlyImportError(this_00,&local_458);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDLImporter::SizeCheck(const void* szPos, const char* szFile, unsigned int iLine)
{
    ai_assert(NULL != szFile);
    if (!szPos || (const unsigned char*)szPos > mBuffer + iFileSize)
    {
        // remove a directory if there is one
        const char* szFilePtr = ::strrchr(szFile,'\\');
        if (!szFilePtr) {
            if(!(szFilePtr = ::strrchr(szFile,'/')))
                szFilePtr = szFile;
        }
        if (szFilePtr)++szFilePtr;

        char szBuffer[1024];
        ::sprintf(szBuffer,"Invalid MDL file. The file is too small "
            "or contains invalid data (File: %s Line: %u)",szFilePtr,iLine);

        throw DeadlyImportError(szBuffer);
    }
}